

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O1

void __thiscall wallet::wallet_tests::BasicOutputTypesTest::test_method(BasicOutputTypesTest *this)

{
  OutputType out_type;
  long lVar1;
  undefined1 auVar2 [16];
  mapped_type_conflict5 *pmVar3;
  mapped_type *pmVar4;
  CCoinControl *in_RCX;
  iterator pvVar5;
  undefined ***pppuVar6;
  iterator pvVar7;
  long lVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined4 in_stack_fffffffffffffe58;
  key_type in_stack_fffffffffffffe5c;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  key_type local_17c;
  size_t local_178;
  lazy_ostream local_170;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  mapped_type_conflict5 *local_130;
  size_t *local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  undefined **local_f8;
  ulong local_f0;
  undefined1 *local_e8;
  size_t **local_e0;
  undefined2 local_d8;
  undefined1 local_d6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock61;
  CoinsResult available_coins;
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  expected_coins_sizes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar8 = 0;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       expected_coins_sizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pmVar3 = std::
             map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
             ::operator[](&expected_coins_sizes,(key_type *)((long)OUTPUT_TYPES._M_elems + lVar8));
    *pmVar3 = 0;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  available_coins.coins._M_t._M_impl._0_4_ = 4;
  pmVar3 = std::
           map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
           ::operator[](&expected_coins_sizes,(key_type *)&available_coins);
  *pmVar3 = 1;
  criticalblock61.super_unique_lock._M_device =
       &(((this->super_ListCoinsTest).super_ListCoinsTestingSetup.wallet._M_t.
          super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
          super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
          super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl)->cs_wallet).
        super_recursive_mutex;
  criticalblock61.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock61.super_unique_lock);
  local_f8 = (undefined **)0x1;
  local_f0 = 2100000000000000;
  local_e8 = (undefined1 *)0x775f05a074000;
  local_e0 = (size_t **)0x0;
  local_d8 = 1;
  local_d6 = 1;
  pvVar5 = (iterator)0x0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = &local_f8;
  pppuVar6 = &local_f8;
  AvailableCoins(&available_coins,
                 (wallet *)
                 (this->super_ListCoinsTest).super_ListCoinsTestingSetup.wallet._M_t.
                 super___uniq_ptr_impl<wallet::CWallet,_std::default_delete<wallet::CWallet>_>._M_t.
                 super__Tuple_impl<0UL,_wallet::CWallet_*,_std::default_delete<wallet::CWallet>_>.
                 super__Head_base<0UL,_wallet::CWallet_*,_false>._M_head_impl,(CWallet *)0x0,in_RCX,
                 (optional<CFeeRate>)(auVar2 << 0x40),
                 (CoinFilterParams *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock61.super_unique_lock);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2bf;
  file.m_begin = (iterator)&local_140;
  msg.m_end = (iterator)pppuVar6;
  msg.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_178 = CoinsResult::Size(&available_coins);
  local_17c = UNKNOWN;
  local_130 = std::
              map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
              ::operator[](&expected_coins_sizes,&local_17c);
  local_128 = &local_178;
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_178 == *local_130);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_118 = "";
  local_e0 = &local_128;
  local_f0 = local_f0 & 0xffffffffffffff00;
  local_f8 = &PTR__lazy_ostream_013d3cf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  criticalblock61.super_unique_lock._M_owns = false;
  criticalblock61.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  pvVar5 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_170,1,2,REQUIRE,0xface23,(size_t)&local_120,0x2bf,&local_f8,
             "expected_coins_sizes[OutputType::UNKNOWN]",&criticalblock61);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2c0;
  file_00.m_begin = (iterator)&local_190;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
             msg_00);
  local_170.m_empty = false;
  local_170._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_160 = boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  local_17c = UNKNOWN;
  pmVar4 = std::
           map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           ::operator[](&available_coins.coins,&local_17c);
  local_178 = ((long)(pmVar4->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pmVar4->super__Vector_base<wallet::COutput,_std::allocator<wallet::COutput>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333;
  local_130 = std::
              map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
              ::operator[](&expected_coins_sizes,(key_type *)&stack0xfffffffffffffe5c);
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_178 == *local_130);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_118 = "";
  local_128 = &local_178;
  local_f0 = local_f0 & 0xffffffffffffff00;
  local_f8 = &PTR__lazy_ostream_013d3cf0;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = &local_128;
  criticalblock61.super_unique_lock._M_owns = false;
  criticalblock61.super_unique_lock._M_device = (mutex_type *)&PTR__lazy_ostream_013d3cf0;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_170,1,2,REQUIRE,0xfb32f8,(size_t)&local_120,0x2c0,&local_f8,
             "expected_coins_sizes[OutputType::UNKNOWN]",&criticalblock61);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  lVar8 = 0;
  do {
    out_type = *(OutputType *)((long)OUTPUT_TYPES._M_elems + lVar8);
    if (out_type != UNKNOWN) {
      pmVar3 = std::
               map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
               ::operator[](&expected_coins_sizes,(key_type *)((long)OUTPUT_TYPES._M_elems + lVar8))
      ;
      *pmVar3 = 2;
      TestCoinsResult(&this->super_ListCoinsTest,out_type,100000000,&expected_coins_sizes);
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x10);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<OutputType,_std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>,_std::_Select1st<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
               *)&available_coins);
  std::
  _Rb_tree<OutputType,_std::pair<const_OutputType,_unsigned_long>,_std::_Select1st<std::pair<const_OutputType,_unsigned_long>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  ::~_Rb_tree(&expected_coins_sizes._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(BasicOutputTypesTest, ListCoinsTest)
{
    std::map<OutputType, size_t> expected_coins_sizes;
    for (const auto& out_type : OUTPUT_TYPES) { expected_coins_sizes[out_type] = 0U; }

    // Verify our wallet has one usable coinbase UTXO before starting
    // This UTXO is a P2PK, so it should show up in the Other bucket
    expected_coins_sizes[OutputType::UNKNOWN] = 1U;
    CoinsResult available_coins = WITH_LOCK(wallet->cs_wallet, return AvailableCoins(*wallet));
    BOOST_CHECK_EQUAL(available_coins.Size(), expected_coins_sizes[OutputType::UNKNOWN]);
    BOOST_CHECK_EQUAL(available_coins.coins[OutputType::UNKNOWN].size(), expected_coins_sizes[OutputType::UNKNOWN]);

    // We will create a self transfer for each of the OutputTypes and
    // verify it is put in the correct bucket after running GetAvailablecoins
    //
    // For each OutputType, We expect 2 UTXOs in our wallet following the self transfer:
    //   1. One UTXO as the recipient
    //   2. One UTXO from the change, due to payment address matching logic

    for (const auto& out_type : OUTPUT_TYPES) {
        if (out_type == OutputType::UNKNOWN) continue;
        expected_coins_sizes[out_type] = 2U;
        TestCoinsResult(*this, out_type, 1 * COIN, expected_coins_sizes);
    }
}